

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O2

address __thiscall
pstore::index::details::internal_node::store_node(internal_node *this,transaction_base *transaction)

{
  uint uVar1;
  size_t size;
  address result;
  shared_ptr<void> ptr;
  pair<std::shared_ptr<void>,_pstore::address> local_38;
  address *local_20;
  shared_ptr<void> *local_18;
  
  uVar1 = internal_node::size(this);
  size = size_bytes((ulong)uVar1);
  ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  result.a_ = 0;
  transaction_base::alloc_rw(&local_38,transaction,size,8);
  local_20 = &result;
  local_18 = &ptr;
  std::tuple<std::shared_ptr<void>&,pstore::address&>::operator=
            ((tuple<std::shared_ptr<void>&,pstore::address&> *)&local_20,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  internal_node((internal_node *)ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return (address)result.a_;
}

Assistant:

address internal_node::store_node (transaction_base & transaction) const {
                std::size_t const num_bytes = internal_node::size_bytes (this->size ());

                std::shared_ptr<void> ptr;
                address result;
                std::tie (ptr, result) = transaction.alloc_rw (num_bytes, alignof (internal_node));
                new (ptr.get ()) internal_node (*this);
                return result;
            }